

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_observe_multiple_test_bucket_counts_Test::TestBody
          (HistogramTest_observe_multiple_test_bucket_counts_Test *this)

{
  allocator<double> *this_00;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_2c8;
  Message local_2c0;
  uint local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_3;
  Message local_298;
  uint local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_2;
  Message local_270;
  uint local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_248;
  Message local_240;
  uint local_234;
  size_type local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  Histogram h;
  ClientMetric metric;
  double local_158 [4];
  iterator local_138;
  size_type local_130;
  vector<double,_std::allocator<double>_> local_128;
  allocator<double> local_109;
  double local_108 [4];
  iterator local_e8;
  size_type local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  allocator<double> local_a9;
  double local_a8 [2];
  iterator local_98;
  size_type local_90;
  vector<double,_std::allocator<double>_> local_88;
  undefined1 local_70 [8];
  Histogram histogram;
  HistogramTest_observe_multiple_test_bucket_counts_Test *this_local;
  
  local_a8[0] = 1.0;
  local_a8[1] = 2.0;
  local_98 = local_a8;
  local_90 = 2;
  histogram.sum_.value_._M_i = (atomic<double>)(atomic<double>)this;
  std::allocator<double>::allocator(&local_a9);
  __l_01._M_len = local_90;
  __l_01._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__l_01,&local_a9);
  Histogram::Histogram((Histogram *)local_70,&local_88);
  std::vector<double,_std::allocator<double>_>::~vector(&local_88);
  std::allocator<double>::~allocator(&local_a9);
  local_108[2] = 3.0;
  local_108[0] = 5.0;
  local_108[1] = 9.0;
  local_e8 = local_108;
  local_e0 = 3;
  std::allocator<double>::allocator(&local_109);
  __l_00._M_len = local_e0;
  __l_00._M_array = local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_d8,__l_00,&local_109);
  Histogram::ObserveMultiple((Histogram *)local_70,&local_d8,20.0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_d8);
  std::allocator<double>::~allocator(&local_109);
  local_158[2] = 6.0;
  local_158[0] = 0.0;
  local_158[1] = 20.0;
  local_138 = local_158;
  local_130 = 3;
  this_00 = (allocator<double> *)((long)&metric.timestamp_ms + 7);
  std::allocator<double>::allocator(this_00);
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::vector<double,_std::allocator<double>_>::vector(&local_128,__l,this_00);
  Histogram::ObserveMultiple((Histogram *)local_70,&local_128,34.0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_128);
  std::allocator<double>::~allocator((allocator<double> *)((long)&metric.timestamp_ms + 7));
  Histogram::Collect((ClientMetric *)
                     &h.bucket.
                      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Histogram *)local_70);
  ClientMetric::Histogram::Histogram
            ((Histogram *)&gtest_ar.message_,
             (Histogram *)
             &metric.summary.quantile.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_230 = std::
              vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              ::size((vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                      *)&h.sample_sum);
  local_234 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_228,"h.bucket.size()","3U",&local_230,&local_234);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar3 = std::
             vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
             ::at((vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                   *)&h.sample_sum,0);
    local_264 = 5;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_260,"h.bucket.at(0).cumulative_count","5U",
               &pvVar3->cumulative_count,&local_264);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
                 ,99,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_270);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    pvVar3 = std::
             vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
             ::at((vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                   *)&h.sample_sum,1);
    local_28c = 0x22;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_288,"h.bucket.at(1).cumulative_count","34U",
               &pvVar3->cumulative_count,&local_28c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar1) {
      testing::Message::Message(&local_298);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
                 ,100,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_298);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_298);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    pvVar3 = std::
             vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
             ::at((vector<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                   *)&h.sample_sum,2);
    local_2b4 = 0x2b;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_2b0,"h.bucket.at(2).cumulative_count","43U",
               &pvVar3->cumulative_count,&local_2b4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
    if (!bVar1) {
      testing::Message::Message(&local_2c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
                 ,0x65,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
      testing::internal::AssertHelper::~AssertHelper(&local_2c8);
      testing::Message::~Message(&local_2c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ClientMetric::Histogram::~Histogram((Histogram *)&gtest_ar.message_);
  ClientMetric::~ClientMetric
            ((ClientMetric *)
             &h.bucket.
              super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Histogram::~Histogram((Histogram *)local_70);
  return;
}

Assistant:

TEST(HistogramTest, observe_multiple_test_bucket_counts) {
  Histogram histogram{{1, 2}};
  histogram.ObserveMultiple({5, 9, 3}, 20);
  histogram.ObserveMultiple({0, 20, 6}, 34);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  ASSERT_EQ(h.bucket.size(), 3U);
  EXPECT_EQ(h.bucket.at(0).cumulative_count, 5U);
  EXPECT_EQ(h.bucket.at(1).cumulative_count, 34U);
  EXPECT_EQ(h.bucket.at(2).cumulative_count, 43U);
}